

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

void __thiscall Catch::XmlEncode::XmlEncode(XmlEncode *this,string *str,ForWhat forWhat)

{
  std::__cxx11::string::string((string *)this,(string *)str);
  this->m_forWhat = forWhat;
  return;
}

Assistant:

XmlEncode::XmlEncode( std::string const& str, ForWhat forWhat )
    :   m_str( str ),
        m_forWhat( forWhat )
    {}